

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

KeywordNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::KeywordNameSyntax,slang::syntax::KeywordNameSyntax_const&>
          (BumpAllocator *this,KeywordNameSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  KeywordNameSyntax *pKVar8;
  
  pKVar8 = (KeywordNameSyntax *)allocate(this,0x28,8);
  uVar3 = *(undefined4 *)&(args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  pSVar2 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  TVar4 = (args->keyword).kind;
  uVar5 = (args->keyword).field_0x2;
  NVar6.raw = (args->keyword).numFlags.raw;
  uVar7 = (args->keyword).rawLen;
  (pKVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  *(undefined4 *)&(pKVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar3;
  (pKVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  (pKVar8->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode = pSVar2;
  (pKVar8->keyword).kind = TVar4;
  (pKVar8->keyword).field_0x2 = uVar5;
  (pKVar8->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pKVar8->keyword).rawLen = uVar7;
  (pKVar8->keyword).info = (args->keyword).info;
  return pKVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }